

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.h
# Opt level: O1

void booster::ptime::millisleep(longlong v)

{
  ptime local_18;
  
  local_18.sec = v / 1000;
  local_18.nsec = ((int)v + (int)local_18.sec * -1000) * 1000000;
  normalize(&local_18);
  booster::ptime::sleep(&local_18);
  return;
}

Assistant:

static void millisleep(long long v)
		{
			sleep(milliseconds(v));
		}